

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

void udp_timer_cb(void *arg)

{
  _Bool _Var1;
  int iVar2;
  nni_time nVar3;
  char *pcVar4;
  nni_aio *aio_00;
  nng_duration local_c8;
  nni_aio *aio;
  char buf [128];
  nng_duration refresh;
  nni_time now;
  uint32_t cursor;
  int rv;
  udp_pipe *p;
  udp_ep *ep;
  void *arg_local;
  
  p = (udp_pipe *)arg;
  ep = (udp_ep *)arg;
  nni_mtx_lock((nni_mtx *)((long)arg + 8));
  now._4_4_ = nni_aio_result((nni_aio *)((long)&p->peer_addr + 0x48));
  if (((now._4_4_ == NNG_ECLOSED) || (now._4_4_ == NNG_ECANCELED)) || (now._4_4_ == NNG_ESTOPPED)) {
    nni_mtx_unlock((nni_mtx *)&p->npipe);
  }
  else if (((p->peer_addr).s_abstract.sa_name[0x22] & 1) == 0) {
    now._0_4_ = 0;
    nVar3 = nni_clock();
    buf._124_4_ = *(undefined4 *)((long)&p[8].peer_addr + 0x10);
    p[8].peer_addr.s_storage.sa_pad[6] = 0xffffffffffffffff;
    while (_Var1 = nni_id_visit((nni_id_map *)&p[6].peer_id,(uint64_t *)0x0,(void **)&cursor,
                                (uint32_t *)&now), _Var1) {
      if (_cursor->expire < nVar3) {
        pcVar4 = nng_str_sockaddr(&_cursor->peer_addr,(char *)&aio,0x80);
        nng_log_info("NNG-UDP-INACTIVE","Pipe peer %s timed out due to inactivity",pcVar4);
        if ((((p[3].peer_addr.s_abstract.sa_name[0x14] & 1) != 0) && (_cursor->peer_id == 0)) &&
           (aio_00 = (nni_aio *)nni_list_first((nni_list *)&p[7].rx_aios.ll_head.ln_prev),
           aio_00 != (nni_aio *)0x0)) {
          nni_aio_list_remove(aio_00);
          nni_aio_finish_error(aio_00,NNG_ETIMEDOUT);
        }
        iVar2 = nni_list_node_active(&_cursor->node);
        if (iVar2 == 0) {
          nni_stat_inc((nni_stat_item *)((long)&p[10].peer_addr + 0x28),1);
          udp_send_disc((udp_ep *)p,_cursor,DISC_INACTIVE);
        }
        else {
          nni_pipe_close(_cursor->npipe);
        }
      }
      else {
        if (((_cursor->dialer & 1U) != 0) && (_cursor->next_creq < nVar3)) {
          udp_send_creq((udp_ep *)p,_cursor);
        }
        if (_cursor->next_wake < p[8].peer_addr.s_storage.sa_pad[6]) {
          p[8].peer_addr.s_storage.sa_pad[6] = _cursor->next_wake;
        }
      }
    }
    if (p[8].peer_addr.s_storage.sa_pad[6] == 0xffffffffffffffff) {
      local_c8 = -1;
    }
    else {
      local_c8 = (int)p[8].peer_addr.s_storage.sa_pad[6] - (int)nVar3;
    }
    buf[0x7c] = (undefined1)local_c8;
    buf[0x7d] = local_c8._1_1_;
    buf[0x7e] = local_c8._2_1_;
    buf[0x7f] = local_c8._3_1_;
    nni_sleep_aio(local_c8,(nng_aio *)((long)&p->peer_addr + 0x48));
    nni_mtx_unlock((nni_mtx *)&p->npipe);
  }
  else {
    nni_mtx_unlock((nni_mtx *)&p->npipe);
  }
  return;
}

Assistant:

static void
udp_timer_cb(void *arg)
{
	udp_ep   *ep = arg;
	udp_pipe *p;
	int       rv;

	nni_mtx_lock(&ep->mtx);
	rv = nni_aio_result(&ep->timeaio);
	switch (rv) {
	case NNG_ECLOSED:
	case NNG_ECANCELED:
	case NNG_ESTOPPED:
		nni_mtx_unlock(&ep->mtx);
		return;
	default:
		if (ep->closed) {
			nni_mtx_unlock(&ep->mtx);
			return;
		}
		break;
	}

	uint32_t     cursor  = 0;
	nni_time     now     = nni_clock();
	nng_duration refresh = ep->refresh;

	ep->next_wake = NNI_TIME_NEVER;
	while (nni_id_visit(&ep->pipes, NULL, (void **) &p, &cursor)) {

		if (now > p->expire) {
			char     buf[128];
			nni_aio *aio;
			nng_log_info("NNG-UDP-INACTIVE",
			    "Pipe peer %s timed out due to inactivity",
			    nng_str_sockaddr(&p->peer_addr, buf, sizeof(buf)));

			// Possibly alert the dialer, so it can restart a new
			// attempt.
			if ((ep->dialer) && (p->peer_id == 0) &&
			    (aio = nni_list_first(&ep->connaios))) {
				nni_aio_list_remove(aio);
				nni_aio_finish_error(aio, NNG_ETIMEDOUT);
			}

			// If we're still on the connect list, then we need
			// take responsibility for cleaning this up.
			if (nni_list_node_active(&p->node)) {
				nni_pipe_close(p->npipe);
				continue;
			}

			// This will probably not be received by the peer,
			// since we aren't getting anything from them. But
			// having it on the wire may help debugging later.
			nni_stat_inc(&ep->st_peer_inactive, 1);
			udp_send_disc(ep, p, DISC_INACTIVE);
			continue;
		}

		if (p->dialer && now > p->next_creq) {
			udp_send_creq(ep, p);
		}
		if (p->next_wake < ep->next_wake) {
			ep->next_wake = p->next_wake;
		}
	}
	refresh = ep->next_wake == NNI_TIME_NEVER
	    ? NNG_DURATION_INFINITE
	    : (nng_duration) (ep->next_wake - now);
	nni_sleep_aio(refresh, &ep->timeaio);

	nni_mtx_unlock(&ep->mtx);
}